

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall
EnrichableI2cAnalyzerSettings::SetSettingsFromInterfaces(EnrichableI2cAnalyzerSettings *this)

{
  byte bVar1;
  char *pcVar2;
  double dVar3;
  Channel aCStack_48 [16];
  Channel local_38 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  AnalyzerSettingInterfaceChannel::GetChannel();
  bVar1 = Channel::operator==(aCStack_48,local_38);
  Channel::~Channel(local_38);
  Channel::~Channel(aCStack_48);
  if (bVar1 == 0) {
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mSdaChannel,aCStack_48);
    Channel::~Channel(aCStack_48);
    AnalyzerSettingInterfaceChannel::GetChannel();
    Channel::operator=(&this->mSclChannel,aCStack_48);
    Channel::~Channel(aCStack_48);
    dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
    this->mAddressDisplay = (AddressDisplay)(long)dVar3;
    pcVar2 = (char *)AnalyzerSettingInterfaceText::GetText();
    this->mParserCommand = pcVar2;
    AnalyzerSettings::ClearChannels();
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSdaChannel,true);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool EnrichableI2cAnalyzerSettings::SetSettingsFromInterfaces()
{
	if( mSdaChannelInterface->GetChannel() == mSclChannelInterface->GetChannel() )
	{
		SetErrorText( "SDA and SCL can't be assigned to the same input." );
		return false;
	}

	mSdaChannel = mSdaChannelInterface->GetChannel();
	mSclChannel = mSclChannelInterface->GetChannel();
	mAddressDisplay = AddressDisplay( U32( mAddressDisplayInterface->GetNumber() ) );
	mParserCommand = mParserCommandInterface->GetText();

	ClearChannels();
	AddChannel( mSdaChannel, "SDA", true );
	AddChannel( mSclChannel, "SCL", true );

	return true;
}